

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::UnpackUnorm2x16Case::createInstance(UnpackUnorm2x16Case *this,Context *ctx)

{
  ShaderType shaderType;
  TestInstance *this_00;
  char *name;
  Context *ctx_local;
  UnpackUnorm2x16Case *this_local;
  
  this_00 = (TestInstance *)operator_new(0xa8);
  shaderType = (this->super_ShaderPackingFunctionCase).m_shaderType;
  name = tcu::TestNode::getName((TestNode *)this);
  UnpackUnorm2x16CaseInstance::UnpackUnorm2x16CaseInstance
            ((UnpackUnorm2x16CaseInstance *)this_00,ctx,shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,name);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new UnpackUnorm2x16CaseInstance(ctx, m_shaderType, m_spec, getName());
	}